

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpSolver.cc
# Opt level: O3

bool __thiscall Glucose::SimpSolver::strengthenClause(SimpSolver *this,CRef cr,Lit l)

{
  Clause *this_00;
  vec<unsigned_int> *pvVar1;
  int *piVar2;
  byte bVar3;
  Lit p;
  vec<unsigned_int> *pvVar4;
  uint uVar5;
  int iVar6;
  CRef CVar7;
  uint uVar8;
  uint *puVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  int n;
  long lVar13;
  ulong uVar14;
  long lVar15;
  bool bVar16;
  
  puVar9 = (this->super_Solver).ca.super_RegionAllocator<unsigned_int>.memory;
  this_00 = (Clause *)(puVar9 + cr);
  Queue<unsigned_int>::insert(&this->subsumption_queue,cr);
  if ((this->super_Solver).certifiedUNSAT == true) {
    if ((this->super_Solver).vbyte == false) {
      lVar15 = *(long *)&this_00->header;
      if (0 < (int)((ulong)lVar15 >> 0x20)) {
        lVar13 = 0;
        do {
          uVar8 = *(uint *)(&this_00[1].header.field_0x0 + lVar13 * 4);
          if (uVar8 != l.x) {
            uVar5 = ~((int)uVar8 >> 1);
            if ((uVar8 & 1) == 0) {
              uVar5 = ((int)uVar8 >> 1) + 1;
            }
            fprintf((FILE *)(this->super_Solver).certifiedOutput,"%i ",(ulong)uVar5);
            lVar15 = *(long *)&this_00->header;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < lVar15 >> 0x20);
      }
      fwrite("0\n",2,1,(FILE *)(this->super_Solver).certifiedOutput);
    }
    else {
      Solver::write_char(&this->super_Solver,'a');
      lVar15 = *(long *)&this_00->header;
      if (0 < (int)((ulong)lVar15 >> 0x20)) {
        lVar13 = 0;
        do {
          iVar6 = *(int *)(&this_00[1].header.field_0x0 + lVar13 * 4);
          if (iVar6 != l.x) {
            Solver::write_lit(&this->super_Solver,iVar6 + 2);
            lVar15 = *(long *)&this_00->header;
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 < lVar15 >> 0x20);
      }
      Solver::write_lit(&this->super_Solver,0);
    }
  }
  if (*(int *)&(this_00->header).field_0x4 == 2) {
    uVar14 = 0;
    removeClause(this,cr,false);
    iVar6 = (int)(*(ulong *)&this_00->header >> 0x20);
    if (iVar6 < 1) {
LAB_00112ccd:
      iVar6 = iVar6 + -1;
      if ((int)uVar14 < iVar6) {
        puVar9 = puVar9 + (ulong)cr + (uVar14 & 0xffffffff) + 4;
        do {
          puVar9[-1] = *puVar9;
          puVar9 = puVar9 + 1;
          uVar8 = (int)uVar14 + 1;
          uVar14 = (ulong)uVar8;
        } while ((int)uVar8 < iVar6);
      }
    }
    else {
      uVar14 = 0;
      do {
        if (*(int *)(&this_00[1].header.field_0x0 + uVar14 * 4) == l.x) goto LAB_00112ccd;
        uVar14 = uVar14 + 1;
      } while (*(ulong *)&this_00->header >> 0x20 != uVar14);
    }
    Clause::shrink(this_00,1);
    uVar14 = *(ulong *)&this_00->header >> 0x20;
    if ((int)(*(ulong *)&this_00->header >> 0x20) < 1) {
      uVar8 = 0;
    }
    else {
      uVar11 = 0;
      uVar8 = 0;
      do {
        uVar8 = uVar8 | 1 << ((byte)(&this_00[1].header.field_0x0)[uVar11 * 4] >> 1 & 0x1f);
        uVar11 = uVar11 + 1;
      } while (uVar14 != uVar11);
    }
    *(uint *)(&this_00[1].header.field_0x0 + uVar14 * 4) = uVar8;
  }
  else {
    if ((this->super_Solver).certifiedUNSAT == true) {
      if ((this->super_Solver).vbyte == true) {
        Solver::write_char(&this->super_Solver,'d');
        if (0 < *(int *)&(this_00->header).field_0x4) {
          lVar15 = 0;
          do {
            Solver::write_lit(&this->super_Solver,
                              *(int *)(&this_00[1].header.field_0x0 + lVar15 * 4) + 2);
            lVar15 = lVar15 + 1;
          } while (lVar15 < *(int *)&(this_00->header).field_0x4);
        }
        Solver::write_lit(&this->super_Solver,0);
      }
      else {
        fwrite("d ",2,1,(FILE *)(this->super_Solver).certifiedOutput);
        if (0 < *(int *)&(this_00->header).field_0x4) {
          lVar15 = 0;
          do {
            uVar8 = *(uint *)(&this_00[1].header.field_0x0 + lVar15 * 4);
            uVar10 = (int)uVar8 >> 1;
            uVar5 = ~uVar10;
            if ((uVar8 & 1) == 0) {
              uVar5 = uVar10 + 1;
            }
            fprintf((FILE *)(this->super_Solver).certifiedOutput,"%i ",(ulong)uVar5);
            lVar15 = lVar15 + 1;
          } while (lVar15 < *(int *)&(this_00->header).field_0x4);
        }
        fwrite("0\n",2,1,(FILE *)(this->super_Solver).certifiedOutput);
      }
    }
    Solver::detachClause(&this->super_Solver,cr,true);
    uVar14 = 0;
    iVar6 = (int)(*(ulong *)&this_00->header >> 0x20);
    if (iVar6 < 1) {
LAB_00112de8:
      iVar6 = iVar6 + -1;
      if ((int)uVar14 < iVar6) {
        puVar9 = puVar9 + (ulong)cr + (uVar14 & 0xffffffff) + 4;
        do {
          puVar9[-1] = *puVar9;
          puVar9 = puVar9 + 1;
          uVar8 = (int)uVar14 + 1;
          uVar14 = (ulong)uVar8;
        } while ((int)uVar8 < iVar6);
      }
    }
    else {
      do {
        if (*(int *)(&this_00[1].header.field_0x0 + uVar14 * 4) == l.x) goto LAB_00112de8;
        uVar14 = uVar14 + 1;
      } while (*(ulong *)&this_00->header >> 0x20 != uVar14);
    }
    Clause::shrink(this_00,1);
    uVar11 = *(ulong *)&this_00->header >> 0x20;
    uVar14 = 0;
    uVar8 = 0;
    if (0 < (int)(*(ulong *)&this_00->header >> 0x20)) {
      uVar12 = 0;
      uVar8 = 0;
      do {
        uVar8 = uVar8 | 1 << ((byte)(&this_00[1].header.field_0x0)[uVar12 * 4] >> 1 & 0x1f);
        uVar12 = uVar12 + 1;
      } while (uVar11 != uVar12);
    }
    *(uint *)(&this_00[1].header.field_0x0 + uVar11 * 4) = uVar8;
    Solver::attachClause(&this->super_Solver,cr);
    n = l.x >> 1;
    pvVar4 = (this->occurs).occs.data;
    pvVar1 = pvVar4 + n;
    iVar6 = pvVar4[n].sz;
    if ((long)iVar6 < 1) {
LAB_00112e98:
      iVar6 = iVar6 + -1;
      if ((int)uVar14 < iVar6) {
        puVar9 = pvVar1->data;
        uVar14 = uVar14 & 0xffffffff;
        do {
          puVar9[uVar14] = puVar9[uVar14 + 1];
          uVar14 = uVar14 + 1;
          iVar6 = pvVar1->sz + -1;
        } while ((int)uVar14 < iVar6);
      }
    }
    else {
      uVar14 = 0;
      do {
        if (pvVar1->data[uVar14] == cr) goto LAB_00112e98;
        uVar14 = uVar14 + 1;
      } while ((long)iVar6 != uVar14);
      iVar6 = iVar6 + -1;
    }
    pvVar1->sz = iVar6;
    piVar2 = (this->n_occ).data + l.x;
    *piVar2 = *piVar2 + -1;
    if (((n < (this->elim_heap).indices.sz) && (-1 < (this->elim_heap).indices.data[n])) ||
       (((this->frozen).data[n] == '\0' &&
        (((this->eliminated).data[n] == '\0' &&
         (((this->super_Solver).assigns.data[n].value & 2) != 0)))))) {
      Heap<Glucose::SimpSolver::ElimLt>::update(&this->elim_heap,n);
    }
  }
  bVar16 = true;
  if (((undefined1  [12])this_00->header & (undefined1  [12])0xffffffff00000000) ==
      (undefined1  [12])0x100000000) {
    p.x = *(int *)&this_00[1].header;
    bVar3 = (this->super_Solver).assigns.data[p.x >> 1].value;
    if ((bVar3 & 2) == 0) {
      if ((bVar3 ^ (byte)p.x & 1) == 1) {
        return false;
      }
    }
    else {
      Solver::uncheckedEnqueue(&this->super_Solver,p,0xffffffff);
    }
    CVar7 = Solver::propagate(&this->super_Solver);
    bVar16 = CVar7 == 0xffffffff;
  }
  return bVar16;
}

Assistant:

bool SimpSolver::strengthenClause(CRef cr, Lit l)
{
    Clause& c = ca[cr];
    assert(decisionLevel() == 0);
    assert(use_simplification);

    // FIX: this is too inefficient but would be nice to have (properly implemented)
    // if (!find(subsumption_queue, &c))
    subsumption_queue.insert(cr);

    if (certifiedUNSAT) {
        if (vbyte) {
            write_char('a');
            for (int i = 0; i < c.size(); i++)
                if (c[i] != l) write_lit(2*(var(c[i])+1) + sign(c[i]));
            write_lit(0);
        }
        else {
            for (int i = 0; i < c.size(); i++)
                if (c[i] != l) fprintf(certifiedOutput, "%i " , (var(c[i]) + 1) * (-2 * sign(c[i]) + 1) );
            fprintf(certifiedOutput, "0\n");
        }
    }

    if (c.size() == 2){
        removeClause(cr);
        c.strengthen(l);
    }else{
        if (certifiedUNSAT) {
            if (vbyte) {
                write_char('d');
                for (int i = 0; i < c.size(); i++)
                    write_lit(2*(var(c[i])+1) + sign(c[i]));
                write_lit(0);
            }
            else {
                fprintf(certifiedOutput, "d ");
                for (int i = 0; i < c.size(); i++)
                    fprintf(certifiedOutput, "%i " , (var(c[i]) + 1) * (-2 * sign(c[i]) + 1) );
                fprintf(certifiedOutput, "0\n");
            }
        }

        detachClause(cr, true);
        c.strengthen(l);
        attachClause(cr);
        remove(occurs[var(l)], cr);
        n_occ[toInt(l)]--;
        updateElimHeap(var(l));
    }

    return c.size() == 1 ? enqueue(c[0]) && propagate() == CRef_Undef : true;
}